

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_tcp_connection.cc
# Opt level: O0

int __thiscall AliTcpConnection::Connect(AliTcpConnection *this)

{
  int iVar1;
  char *host;
  undefined1 local_28 [8];
  sockaddr_in addr;
  AliTcpConnection *this_local;
  
  addr.sin_zero = (uchar  [8])this;
  iVar1 = socket(2,1,6);
  this->fd_ = iVar1;
  memset(local_28,0,0x10);
  host = (char *)std::__cxx11::string::c_str();
  iVar1 = resolve_dns(host,this->port_,(sockaddr *)local_28);
  if (iVar1 == 0) {
    this_local._4_4_ = connect(this->fd_,(sockaddr *)local_28,0x10);
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int AliTcpConnection::Connect() {
  fd_ = socket(AF_INET, SOCK_STREAM, IPPROTO_TCP);
  sockaddr_in addr = {};
  if(resolve_dns(host_.c_str(), port_, (sockaddr*)&addr) != 0) {\
    goto err_failed;
  }

  return ::connect(fd_, (sockaddr*)&addr, sizeof(sockaddr_in));
err_failed:
  return -1;
}